

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

void rest_rooms(memfile *mf,level *lev)

{
  int32_t iVar1;
  short local_1a;
  short i;
  level *lev_local;
  memfile *mf_local;
  
  mfmagic_check(mf,0x54424452);
  iVar1 = mread32(mf);
  lev->nroom = iVar1;
  lev->nsubroom = 0;
  for (local_1a = 0; (int)local_1a < lev->nroom; local_1a = local_1a + 1) {
    rest_room(mf,lev,lev->rooms + local_1a);
    lev->rooms[local_1a].resident = (monst *)0x0;
  }
  lev->rooms[lev->nroom].hx = -1;
  lev->subrooms[lev->nsubroom].hx = -1;
  return;
}

Assistant:

void rest_rooms(struct memfile *mf, struct level *lev)
{
	short i;

	mfmagic_check(mf, ROOMS_MAGIC); /* "RDAT" */
	lev->nroom = mread32(mf);
	lev->nsubroom = 0;
	for (i = 0; i<lev->nroom; i++) {
	    rest_room(mf, lev, &lev->rooms[i]);
	    lev->rooms[i].resident = NULL;
	}
	lev->rooms[lev->nroom].hx = -1;		/* restore ending flags */
	lev->subrooms[lev->nsubroom].hx = -1;
}